

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_input.hpp
# Opt level: O1

pair_t tao::pegtl::internal::peek_utf8::
       peek<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
                 (string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *in)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  pbVar2 = (byte *)(in->
                   super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).
                   super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .m_current.data;
  bVar1 = *pbVar2;
  uVar4 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    uVar6 = (uint)bVar1;
    if ((uVar6 & 0xffffffe0) == 0xc0) {
      if (1 < (ulong)((long)(in->
                            super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).
                            super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .m_end - (long)pbVar2)) {
        bVar3 = true;
        if (((pbVar2[1] & 0xffffffc0) == 0x80) && (uVar4 = (bVar1 & 0x1f) << 6, 0x7f < uVar4)) {
          uVar4 = pbVar2[1] & 0x3f | uVar4;
          bVar3 = false;
        }
        if (!bVar3) {
          uVar5 = 0x200000000;
          goto LAB_0015cafb;
        }
      }
    }
    else if ((uVar6 & 0xfffffff0) == 0xe0) {
      if (2 < (ulong)((long)(in->
                            super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).
                            super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .m_end - (long)pbVar2)) {
        bVar3 = true;
        if ((pbVar2[2] & 0xffffffc0) == 0x80 && (pbVar2[1] & 0xffffffc0) == 0x80) {
          uVar4 = (bVar1 & 0xf) << 6;
          uVar6 = pbVar2[1] & 0x3f | uVar4;
          if (0x1f < uVar6) {
            uVar4 = pbVar2[2] & 0x3f | uVar6 << 6;
            bVar3 = false;
          }
        }
        if (!bVar3) {
          uVar5 = 0x300000000;
          goto LAB_0015cafb;
        }
      }
    }
    else if (((uVar6 & 0xfffffff8) == 0xf0) &&
            (3 < (ulong)((long)(in->
                               super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ).
                               super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               .m_end - (long)pbVar2))) {
      bVar3 = true;
      if (((pbVar2[1] & 0xffffffc0) == 0x80) &&
         (((pbVar2[2] & 0xffffffc0) == 0x80 && ((pbVar2[3] & 0xffffffc0) == 0x80)))) {
        uVar4 = (uVar6 & 7) * 0x40;
        uVar6 = pbVar2[1] & 0x3f;
        if ((uVar6 + uVar4) - 0x10 < 0x100) {
          uVar4 = pbVar2[3] & 0x3f | (pbVar2[2] & 0x3f) << 6 | (uVar6 | uVar4) << 0xc;
          bVar3 = false;
        }
      }
      if (!bVar3) {
        uVar5 = 0x400000000;
        goto LAB_0015cafb;
      }
    }
    uVar4 = 0;
    uVar5 = 0;
  }
  else {
    uVar5 = 0x100000000;
  }
LAB_0015cafb:
  return (pair_t)(uVar4 | uVar5);
}

Assistant:

const char* current() const noexcept
            {
               return m_current.data;
            }